

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O0

string * __thiscall
dit::(anonymous_namespace)::getCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TextureFormat format)

{
  ostream *poVar1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream str;
  ChannelOrder local_18;
  ChannelType CStack_14;
  TextureFormat format_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  CStack_14 = (ChannelType)((ulong)this >> 0x20);
  poVar1 = tcu::operator<<((ostream *)local_190,CStack_14);
  poVar1 = std::operator<<(poVar1,"_");
  local_18 = (ChannelOrder)this;
  tcu::operator<<(poVar1,local_18);
  std::__cxx11::ostringstream::str();
  de::toLower(__return_storage_ptr__,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string getCaseName (TextureFormat format)
{
	std::ostringstream str;

	str << format.type << "_" << format.order;

	return de::toLower(str.str());
}